

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::stencilFuncSeparate
          (ReferenceContext *this,deUint32 face,deUint32 func,int ref,deUint32 mask)

{
  if ((func & 0xfffffff8) == 0x200) {
    if (face != 0x404) {
      if (face == 0x405) goto LAB_004da03b;
      if (face != 0x408) goto LAB_004da04f;
    }
    this->m_stencil[0].func = func;
    this->m_stencil[0].ref = ref;
    this->m_stencil[0].opMask = mask;
    if ((face == 0x408) || (face == 0x405)) {
LAB_004da03b:
      this->m_stencil[1].func = func;
      this->m_stencil[1].ref = ref;
      this->m_stencil[1].opMask = mask;
      return;
    }
  }
  else {
LAB_004da04f:
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
      return;
    }
  }
  return;
}

Assistant:

static bool isValidCompareFunc (deUint32 func)
{
	switch (func)
	{
		case GL_NEVER:
		case GL_LESS:
		case GL_LEQUAL:
		case GL_GREATER:
		case GL_GEQUAL:
		case GL_EQUAL:
		case GL_NOTEQUAL:
		case GL_ALWAYS:
			return true;

		default:
			return false;
	}
}